

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_19cd26::SQLiteBuildDB::getKeysWithResult
          (SQLiteBuildDB *this,
          vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> *keys_out,
          vector<llbuild::core::Result,_std::allocator<llbuild::core::Result>_> *results_out,
          string *error_out)

{
  sqlite3_stmt *psVar1;
  pointer __dest;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  undefined4 extraout_var;
  value_type *pvVar5;
  value_type *pvVar6;
  void *__src;
  uint64_t uVar7;
  KeyID KVar8;
  int __oflag;
  bool bVar9;
  int i;
  ulong uVar10;
  DBKeyID dbKeyID;
  KeyID engineKeyID;
  Result result;
  BinaryDecoder decoder;
  KeyType key;
  Child local_78 [2];
  undefined2 local_68;
  Twine local_60;
  Twine local_48;
  
  if (this->delegate == (BuildDBDelegate *)0x0) {
    __assert_fail("delegate != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                  ,0x2e4,
                  "virtual bool (anonymous namespace)::SQLiteBuildDB::getKeysWithResult(std::vector<KeyType> &, std::vector<Result> &, std::string *)"
                 );
  }
  std::mutex::lock(&this->dbMutex);
  iVar2 = open(this,(char *)error_out,__oflag);
  if ((char)iVar2 != '\0') {
    psVar1 = this->getKeysWithResultStmt;
    iVar2 = sqlite3_reset(psVar1);
    if (iVar2 == 0) {
      while( true ) {
        iVar2 = sqlite3_step(psVar1);
        if (iVar2 != 100) break;
        iVar2 = sqlite3_column_count(psVar1);
        if (iVar2 != 9) {
          __assert_fail("sqlite3_column_count(stmt) == 9",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                        ,0x2f0,
                        "virtual bool (anonymous namespace)::SQLiteBuildDB::getKeysWithResult(std::vector<KeyType> &, std::vector<Result> &, std::string *)"
                       );
        }
        dbKeyID.value = sqlite3_column_int64(psVar1,0);
        pcVar4 = (char *)sqlite3_column_text(psVar1,1);
        iVar2 = sqlite3_column_bytes(psVar1,1);
        llbuild::core::KeyType::KeyType(&key,pcVar4,(long)iVar2);
        iVar2 = (*this->delegate->_vptr_BuildDBDelegate[2])(this->delegate,&key);
        engineKeyID._value = CONCAT44(extraout_var,iVar2);
        pvVar5 = llvm::
                 DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                 ::FindAndConstruct((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                                     *)&this->engineKeyIDs,&dbKeyID);
        (pvVar5->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value = engineKeyID._value;
        pvVar6 = llvm::
                 DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                 ::FindAndConstruct((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                                     *)&this->dbKeyIDs,&engineKeyID);
        (pvVar6->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value = dbKeyID.value;
        result.dependencies.flags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        result.dependencies.flags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        result.dependencies.keys.
        super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        result.dependencies.flags.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        result.dependencies.keys.
        super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        result.dependencies.keys.
        super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        result.computedAt = 0;
        result.builtAt = 0;
        result.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        result.signature.value = 0;
        result.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        result.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        iVar2 = sqlite3_column_bytes(psVar1,2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&result.value,(long)iVar2);
        __dest = result.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        __src = (void *)sqlite3_column_blob(psVar1,2);
        memcpy(__dest,__src,(long)iVar2);
        result.builtAt = sqlite3_column_int64(psVar1,3);
        result.computedAt = sqlite3_column_int64(psVar1,4);
        result.start = (Timestamp)sqlite3_column_double(psVar1,5);
        result.end = (Timestamp)sqlite3_column_double(psVar1,6);
        uVar3 = sqlite3_column_bytes(psVar1,7);
        pcVar4 = (char *)sqlite3_column_blob(psVar1,7);
        if ((uVar3 & 7) != 0) {
          llvm::Twine::Twine(&local_60,"unexpected contents for database result: ");
          local_68 = 0x10a;
          local_78[0].decUI = (uint)dbKeyID.value;
          llvm::Twine::concat(&local_48,&local_60,(Twine *)local_78);
          llvm::Twine::str_abi_cxx11_((string *)&decoder,&local_48);
          std::__cxx11::string::operator=((string *)error_out,(string *)&decoder);
          std::__cxx11::string::_M_dispose();
LAB_0013e46f:
          llbuild::core::Result::~Result(&result);
          std::__cxx11::string::_M_dispose();
          bVar9 = false;
          goto LAB_0013e175;
        }
        llbuild::core::DependencyKeyIDs::resize(&result.dependencies,(long)((int)uVar3 >> 3));
        decoder.pos = 0;
        decoder.data.Data = pcVar4;
        decoder.data.Length = (long)(int)uVar3;
        for (uVar10 = 0; (uint)((int)uVar3 >> 3) != uVar10; uVar10 = uVar10 + 1) {
          uVar7 = llbuild::basic::BinaryDecoder::read64(&decoder);
          KVar8 = getKeyIDForID(this,(DBKeyID)(uVar7 >> 2),error_out);
          if (error_out->_M_string_length != 0) goto LAB_0013e46f;
          result.dependencies.keys.
          super__Vector_base<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10]._value = KVar8._value;
          result.dependencies.flags.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] = (byte)uVar7 & 3;
        }
        result.signature.value = sqlite3_column_int64(psVar1,8);
        std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::push_back
                  (keys_out,&key);
        std::vector<llbuild::core::Result,_std::allocator<llbuild::core::Result>_>::push_back
                  (results_out,&result);
        llbuild::core::Result::~Result(&result);
        std::__cxx11::string::_M_dispose();
      }
      bVar9 = true;
      goto LAB_0013e175;
    }
    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_((string *)&result,this);
    std::__cxx11::string::operator=((string *)error_out,(string *)&result);
    std::__cxx11::string::_M_dispose();
  }
  bVar9 = false;
LAB_0013e175:
  pthread_mutex_unlock((pthread_mutex_t *)&this->dbMutex);
  return bVar9;
}

Assistant:

bool getKeysWithResult(std::vector<KeyType> &keys_out, std::vector<Result> &results_out, std::string* error_out) override {
    
    assert(delegate != nullptr);
    std::lock_guard<std::mutex> guard(dbMutex);
    
    if (!open(error_out))
      return false;
    
    auto stmt = getKeysWithResultStmt;
    
    int result = sqlite3_reset(stmt);
    checkSQLiteResultOKReturnFalse(result);
    
    while (sqlite3_step(stmt) == SQLITE_ROW) {
      assert(sqlite3_column_count(stmt) == 9);
      
      auto dbKeyID = DBKeyID(sqlite3_column_int64(stmt, 0));
      auto key = KeyType((const char *)sqlite3_column_text(stmt, 1), sqlite3_column_bytes(stmt, 1));
      
      auto engineKeyID = delegate->getKeyID(key);
      engineKeyIDs[dbKeyID] = engineKeyID;
      dbKeyIDs[engineKeyID] = dbKeyID;
      
      Result result;
      int numValueBytes = sqlite3_column_bytes(stmt, 2);
      result.value.resize(numValueBytes);
      memcpy(result.value.data(),
             sqlite3_column_blob(stmt, 2),
             numValueBytes);
      result.builtAt = sqlite3_column_int64(stmt, 3);
      result.computedAt = sqlite3_column_int64(stmt, 4);
      result.start = sqlite3_column_double(stmt, 5);
      result.end = sqlite3_column_double(stmt, 6);
      auto numDependencyBytes = sqlite3_column_bytes(stmt, 7);
      auto dependencyBytes = sqlite3_column_blob(stmt, 7);
      
      // map dependencies
      int numDependencies = numDependencyBytes / sizeof(uint64_t);
      if (numDependencyBytes != static_cast<int>(numDependencies * sizeof(uint64_t))) {
        *error_out = (llvm::Twine("unexpected contents for database result: ") +
                      llvm::Twine((int)dbKeyID.value)).str();
        return false;
      }

      result.dependencies.resize(numDependencies);
      basic::BinaryDecoder decoder(
                                   StringRef((const char*)dependencyBytes, numDependencyBytes));
      for (auto i = 0; i != numDependencies; ++i) {
        uint64_t raw;
        decoder.read(raw);
        bool orderOnly = raw & 1;
        bool singleUse = (raw >> 1) & 1;
        DBKeyID dbKeyID(raw >> 2);
        
        // Map the database key ID into an engine key ID (note that we already
        // hold the dbMutex at this point as required by getKeyIDforID())
        KeyID keyID = getKeyIDForID(dbKeyID, error_out);
        if (!error_out->empty()) {
          return false;
        }
        result.dependencies.set(i, keyID, orderOnly, singleUse);
      }
      
      result.signature = basic::CommandSignature(sqlite3_column_int64(stmt, 8));
      
      keys_out.push_back(key);
      results_out.push_back(result);
    }
    
    return true;
  }